

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c74_min_object.h
# Opt level: O0

strings * __thiscall
c74::min::object<TestObject,(c74::min::threadsafe)1>::tags_abi_cxx11_
          (strings *__return_storage_ptr__,void *this)

{
  bool bVar1;
  string local_70;
  reference local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *a_tag;
  iterator __end3;
  iterator __begin3;
  strings *__range3;
  object<TestObject,_(c74::min::threadsafe)1> *this_local;
  strings *t;
  
  Catch::clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  get_tags<TestObject>(__return_storage_ptr__);
  __end3 = Catch::clara::std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(__return_storage_ptr__);
  a_tag = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          Catch::clara::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end(__return_storage_ptr__);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end3,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&a_tag), bVar1) {
    local_50 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end3);
    min::str::trim(&local_70,local_50);
    std::__cxx11::string::operator=((string *)local_50,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end3);
  }
  return __return_storage_ptr__;
}

Assistant:

virtual strings tags() const override
    {
        strings t;
        get_tags<min_class_type>(t);
        for (auto& a_tag : t) {
            a_tag = str::trim(a_tag);
        }
        return t;
    }